

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

FieldDescriptorProto *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>(Arena *arena)

{
  FieldDescriptorProto *this;
  
  if (arena == (Arena *)0x0) {
    this = (FieldDescriptorProto *)operator_new(0x58);
    FieldDescriptorProto::FieldDescriptorProto(this);
  }
  else {
    AllocHook(arena,(type_info *)&FieldDescriptorProto::typeinfo,0x58);
    this = (FieldDescriptorProto *)internal::ArenaImpl::AllocateAligned(&arena->impl_,0x58);
    FieldDescriptorProto::FieldDescriptorProto(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}